

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigenval.c
# Opt level: O3

void SearchEigenval(size_t n,double *Alpha,double *Beta,size_t k,double BoundMin,double BoundMax,
                   Boolean *Found,double *Lambda)

{
  size_t sVar1;
  Boolean BVar2;
  double Lambda_00;
  double dVar3;
  
  sVar1 = NoSmallerEigenvals(n,Alpha,Beta,BoundMin);
  BVar2 = False;
  if ((sVar1 < k) && (sVar1 = NoSmallerEigenvals(n,Alpha,Beta,BoundMax), BVar2 = False, k <= sVar1))
  {
    dVar3 = EigenvalEps * 0.01;
    if ((ABS(BoundMax) + ABS(BoundMin)) * dVar3 < ABS(BoundMax - BoundMin)) {
      do {
        Lambda_00 = (BoundMax + BoundMin) * 0.5;
        *Lambda = Lambda_00;
        sVar1 = NoSmallerEigenvals(n,Alpha,Beta,Lambda_00);
        if (k <= sVar1) {
          BoundMax = Lambda_00;
          Lambda_00 = BoundMin;
        }
        BoundMin = Lambda_00;
      } while ((ABS(BoundMax) + ABS(Lambda_00)) * dVar3 < ABS(BoundMax - Lambda_00));
    }
    *Lambda = BoundMax;
    BVar2 = True;
  }
  *Found = BVar2;
  return;
}

Assistant:

static void SearchEigenval(size_t n, double *Alpha, double *Beta, size_t k,
         double BoundMin, double BoundMax, Boolean *Found, double *Lambda)
/* search the k-th eigenvalue of the tridiagonal matrix
   (Beta[i-1] Alpha[i] Beta[i]) (where 1 <= i <= n) 
   by means of the method of bisection */
{
    /*
     *  for details to the method of bisection see
     *
     *  G. H. Golub, Ch. F. van Loan:
     *  Matrix Computations;
     *  North Oxford Academic, Oxford, 1986
     *
     */
   
    if (NoSmallerEigenvals(n, Alpha, Beta, BoundMin) < k
	&& NoSmallerEigenvals(n, Alpha, Beta, BoundMax) >= k) {
        while (fabs(BoundMax - BoundMin) > 0.01 * EigenvalEps 
	    * (fabs(BoundMin) + fabs(BoundMax))) {
            *Lambda = 0.5 * (BoundMin + BoundMax);
	    if (NoSmallerEigenvals(n, Alpha, Beta, *Lambda) >= k) 
	        BoundMax = *Lambda;
   	    else
	        BoundMin = *Lambda;
        }
	*Lambda = BoundMax;

	*Found = True;
    } else {
	*Found = False;
    }
}